

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O0

bool __thiscall ON_NurbsSurface::SetCV(ON_NurbsSurface *this,int i,int j,ON_3dPoint *point)

{
  double *pdVar1;
  double *cv;
  bool rc;
  ON_3dPoint *point_local;
  int j_local;
  int i_local;
  ON_NurbsSurface *this_local;
  
  ON_Surface::DestroySurfaceTree(&this->super_ON_Surface);
  cv._7_1_ = false;
  pdVar1 = CV(this,i,j);
  if (pdVar1 != (double *)0x0) {
    *pdVar1 = point->x;
    if ((1 < this->m_dim) && (pdVar1[1] = point->y, 2 < this->m_dim)) {
      pdVar1[2] = point->z;
    }
    if (this->m_is_rat != 0) {
      pdVar1[this->m_dim] = 1.0;
    }
    cv._7_1_ = true;
  }
  return cv._7_1_;
}

Assistant:

bool 
ON_NurbsSurface::SetCV( int i, int j, const ON_3dPoint& point )
{
  DestroySurfaceTree();

  bool rc = false;
  double* cv = CV(i,j);
  if ( cv ) {
    cv[0] = point.x;
    if ( m_dim > 1 ) {
      cv[1] = point.y;
      if ( m_dim > 2 )
        cv[2] = point.z;
    }
    if ( m_is_rat ) {
      cv[m_dim] = 1.0;
    }
    rc = true;
  }
  return rc;
}